

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::remove_escaped_characters(string *str)

{
  bool bVar1;
  reference pcVar2;
  difference_type dVar3;
  invalid_argument *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  uint32_t res_1;
  int ii_1;
  uint32_t mplier_1;
  uint32_t code_1;
  uint32_t res;
  int ii;
  uint32_t mplier;
  uint32_t code;
  size_type ecloc;
  const_iterator loc;
  string *out;
  undefined7 in_stack_fffffffffffffd98;
  char in_stack_fffffffffffffd9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  allocator<char> *in_stack_fffffffffffffdd0;
  string *this;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  uint32_t in_stack_fffffffffffffdfc;
  string *in_stack_fffffffffffffe00;
  string local_1a0 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  undefined1 local_171;
  string local_170 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  uint32_t local_144;
  int local_140;
  uint local_13c;
  int local_138;
  undefined1 local_131;
  string local_130 [32];
  char *local_110;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  undefined1 local_f9;
  string local_f8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  uint32_t local_cc;
  int local_c8;
  uint local_c4;
  int local_c0;
  undefined1 local_b9;
  string local_b8 [32];
  char *local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  size_type local_80;
  undefined1 local_71;
  string local_70 [32];
  char *local_50;
  __unspec local_41;
  char *local_40;
  type local_31;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [3];
  undefined1 local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  ::std::__cxx11::string::string(in_stack_fffffffffffffdb0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(local_10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_30[0]._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
  do {
    local_40 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                 (in_stack_fffffffffffffda8);
    local_31 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>
                               ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffda8,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffda0);
    std::__cmp_cat::__unspec::__unspec(&local_41,(__unspec *)0x0);
    bVar1 = std::operator<(local_31);
    if (!bVar1) {
      return in_RDI;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_30);
    if (*pcVar2 == '\\') {
      local_50 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                   (in_stack_fffffffffffffda8);
      dVar3 = __gnu_cxx::operator-
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
      if (dVar3 < 2) {
        local_71 = 1;
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),this)
        ;
        ::std::invalid_argument::invalid_argument(piVar4,local_70);
        local_71 = 0;
        __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                    ::std::invalid_argument::~invalid_argument);
      }
      local_88 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffda8,(difference_type)in_stack_fffffffffffffda0
                            );
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_88);
      local_80 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_of(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9f,0x1974fa);
      if (local_80 == 0xffffffffffffffff) {
        local_90 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffda8,
                               (difference_type)in_stack_fffffffffffffda0);
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_90);
        if (*pcVar2 == 'u') {
          local_98 = (char *)std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                       (in_stack_fffffffffffffda8);
          dVar3 = __gnu_cxx::operator-
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffda0,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
          if (dVar3 < 6) {
            local_b9 = 1;
            piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
            ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                             this);
            ::std::invalid_argument::invalid_argument(piVar4,local_b8);
            local_b9 = 0;
            __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
          local_c0 = 0;
          local_c4 = 0x1000;
          for (local_c8 = 2; local_c8 < 6; local_c8 = local_c8 + 1) {
            local_d8 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)in_stack_fffffffffffffda8,
                                   (difference_type)in_stack_fffffffffffffda0);
            pcVar2 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_d8);
            local_cc = hexConvert(*pcVar2);
            if (0xf < local_cc) {
              local_f9 = 1;
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8)
                               ,this);
              ::std::invalid_argument::invalid_argument(piVar4,local_f8);
              local_f9 = 0;
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            local_c0 = local_cc * local_c4 + local_c0;
            local_c4 = local_c4 >> 4;
          }
          append_codepoint(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+=(local_30,5);
        }
        else {
          local_108 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffffda8,
                                  (difference_type)in_stack_fffffffffffffda0);
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_108);
          if (*pcVar2 == 'U') {
            local_110 = (char *)std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                end(in_stack_fffffffffffffda8);
            dVar3 = __gnu_cxx::operator-
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffda0,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
            if (dVar3 < 10) {
              local_131 = 1;
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8)
                               ,this);
              ::std::invalid_argument::invalid_argument(piVar4,local_130);
              local_131 = 0;
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            local_138 = 0;
            local_13c = 0x10000000;
            for (local_140 = 2; local_140 < 10; local_140 = local_140 + 1) {
              local_150 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_stack_fffffffffffffda8,
                                      (difference_type)in_stack_fffffffffffffda0);
              pcVar2 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_150);
              local_144 = hexConvert(*pcVar2);
              if (0xf < local_144) {
                local_171 = 1;
                piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdef,
                                                  in_stack_fffffffffffffde8),this);
                ::std::invalid_argument::invalid_argument(piVar4,local_170);
                local_171 = 0;
                __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                            ::std::invalid_argument::~invalid_argument);
              }
              local_138 = local_144 * local_13c + local_138;
              local_13c = local_13c >> 4;
            }
            append_codepoint(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+=(local_30,9);
          }
          else {
            local_180 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffffda8,
                                    (difference_type)in_stack_fffffffffffffda0);
            pcVar2 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_180);
            if (*pcVar2 != '0') {
              __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x10);
              __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffdff;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string<std::allocator<char>>
                        (this,(char *)in_RDI,in_stack_fffffffffffffdd0);
              local_210 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)__lhs,(difference_type)__rhs);
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_210);
              ::std::operator+(__lhs,(char)((ulong)__rhs >> 0x38));
              ::std::operator+(__lhs,(char *)__rhs);
              ::std::operator+(__lhs,__rhs);
              ::std::invalid_argument::invalid_argument((invalid_argument *)__rhs,local_1a0);
              __cxa_throw(__rhs,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(in_stack_fffffffffffffdb0,(char)((ulong)in_stack_fffffffffffffda8 >> 0x38));
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(local_30);
          }
        }
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  (in_stack_fffffffffffffda0,
                   CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffffdb0,(char)((ulong)in_stack_fffffffffffffda8 >> 0x38));
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_30);
      }
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(local_30);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (in_stack_fffffffffffffdb0,(char)((ulong)in_stack_fffffffffffffda8 >> 0x38));
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_30);
  } while( true );
}

Assistant:

CLI11_INLINE std::string remove_escaped_characters(const std::string &str) {

    std::string out;
    out.reserve(str.size());
    for(auto loc = str.begin(); loc < str.end(); ++loc) {
        if(*loc == '\\') {
            if(str.end() - loc < 2) {
                throw std::invalid_argument("invalid escape sequence " + str);
            }
            auto ecloc = escapedCharsCode.find_first_of(*(loc + 1));
            if(ecloc != std::string::npos) {
                out.push_back(escapedChars[ecloc]);
                ++loc;
            } else if(*(loc + 1) == 'u') {
                // must have 4 hex characters
                if(str.end() - loc < 6) {
                    throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16};
                for(int ii = 2; ii < 6; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 5;
            } else if(*(loc + 1) == 'U') {
                // must have 8 hex characters
                if(str.end() - loc < 10) {
                    throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16 * 16 * 16 * 16 * 16};
                for(int ii = 2; ii < 10; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 9;
            } else if(*(loc + 1) == '0') {
                out.push_back('\0');
                ++loc;
            } else {
                throw std::invalid_argument(std::string("unrecognized escape sequence \\") + *(loc + 1) + " in " + str);
            }
        } else {
            out.push_back(*loc);
        }
    }
    return out;
}